

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_custom_callback2(void)

{
  int iVar1;
  int iVar2;
  char *local_f08;
  char *args [4];
  size_t j;
  size_t i;
  char optname [256];
  char title [256];
  char grpname [256];
  int vals [31] [24];
  uint local_30;
  int b;
  _test_data_t data;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)&data,0,"program");
  if (iVar1 == 0) {
    vals[0x1e][0x17] = 0;
    local_f08 = "program";
    args[0] = "--beta";
    args[1] = "--alpha";
    args[2] = "128x64";
    cargo_set_flags((cargo_t)data,CARGO_AUTOCLEAN);
    iVar1 = cargo_add_option((cargo_t)data,0,"--alpha","The alpha","c",_test_cb,&local_30);
    iVar2 = cargo_add_option((cargo_t)data,0,"--beta","The beta","b",vals[0x1e] + 0x17);
    if (iVar2 == 0 && iVar1 == 0) {
      for (j = 0; j < 0x1f; j = j + 1) {
        cargo_snprintf(title + 0xf8,0x100,"group%d",j + 1);
        cargo_snprintf(optname + 0xf8,0x100,"The Group%d",j + 1);
        iVar1 = cargo_add_group((cargo_t)data,0,title + 0xf8,optname + 0xf8,"Group");
        if (iVar1 != 0) {
          pcStack_18 = "Failed to add group";
          goto LAB_0011faca;
        }
        for (args[3] = (char *)0x0; args[3] < (char *)0x18; args[3] = args[3] + 1) {
          cargo_snprintf((char *)&i,0x100,"--optg%02do%02d",j + 1,args[3] + 1);
          iVar1 = cargo_add_option((cargo_t)data,0,(char *)&i,
                                   "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut aliquip ex ea commodo consequat. Duis aute irure dolor in reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla pariatur. Excepteur sint occaecat cupidatat non proident, sunt in culpa qui officia deserunt mollit anim id est laborum."
                                   ,"i",vals[j - 1] + (long)(args[3] + 0x16));
          iVar2 = cargo_group_add_option((cargo_t)data,title + 0xf8,(char *)&i);
          if (iVar2 != 0 || iVar1 != 0) {
            pcStack_18 = "Failed to add option";
            goto LAB_0011faca;
          }
        }
      }
      cargo_parse((cargo_t)data,0,1,4,&local_f08);
      printf("%dx%d\n",(ulong)local_30,(ulong)(uint)b);
      if (local_30 == 0x80) {
        if (b == 0x40) {
          if (vals[0x1e][0x17] == 1) {
            cargo_parse((cargo_t)data,0,1,4,&local_f08);
            printf("%dx%d\n",(ulong)local_30,(ulong)(uint)b);
            if (local_30 == 0x80) {
              if (b == 0x40) {
                if (vals[0x1e][0x17] != 1) {
                  pcStack_18 = "Expected b == 1";
                }
              }
              else {
                pcStack_18 = "Height expected to be 128";
              }
            }
            else {
              pcStack_18 = "Width expected to be 128";
            }
          }
          else {
            pcStack_18 = "Expected b == 1";
          }
        }
        else {
          pcStack_18 = "Height expected to be 128";
        }
      }
      else {
        pcStack_18 = "Width expected to be 128";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
LAB_0011faca:
    cargo_destroy((cargo_t *)&data);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_custom_callback2)
{
    _test_data_t data;
    int b = 0;

    #define GROUP_COUNT (CARGO_DEFAULT_MAX_GROUPS * 8 - 1)
    #define GROUP_OPT_COUNT (CARGO_DEFAULT_MAX_GROUP_OPTS * 3)
    int vals[GROUP_COUNT][GROUP_OPT_COUNT];
    char grpname[256];
    char title[256];
    char optname[256];
    size_t i;
    size_t j;
    char *args[] = { "program", "--beta", "--alpha", "128x64" };

    cargo_set_flags(cargo, CARGO_AUTOCLEAN);

    // Add a custom argument
    ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "c", _test_cb, &data);

    ret |= cargo_add_option(cargo, 0, "--beta", "The beta", "b", &b);
    cargo_assert(ret == 0, "Failed to add options");

    // Add many groups. We do this to trigger a reallocation.
    for (i = 0; i < GROUP_COUNT; i++)
    {
        cargo_snprintf(grpname, sizeof(grpname), "group%d", i+1);
        cargo_snprintf(title, sizeof(title), "The Group%d", i+1);
        ret |= cargo_add_group(cargo, 0, grpname, title, "Group");
        cargo_assert(ret == 0, "Failed to add group");

        for (j = 0; j < GROUP_OPT_COUNT; j++)
        {
            cargo_snprintf(optname, sizeof(optname), "--optg%02do%02d", i+1, j+1);
            ret |= cargo_add_option(cargo, 0, optname, LOREM_IPSUM, "i", &vals[i][j]);
            ret |= cargo_group_add_option(cargo, grpname, optname);
            cargo_assert(ret == 0, "Failed to add option");
        }
    }

    cargo_assert(ret == 0, "Failed to add groups");

    // Test to parse twice.
    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");
    cargo_assert(b == 1, "Expected b == 1");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");
    cargo_assert(b == 1, "Expected b == 1");

    _TEST_CLEANUP();
}